

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_test.c
# Opt level: O3

int main(void)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int iVar8;
  uint uVar9;
  char *__s;
  undefined1 auVar10 [32];
  unsigned_long_long mlen;
  unsigned_long_long smlen;
  uchar message [50];
  uchar omessage [50];
  uchar pk [33];
  uchar sk [49];
  uchar sm [34086];
  unsigned_long_long local_8638;
  unsigned_long_long local_8630;
  undefined8 local_8628;
  undefined8 uStack_8620;
  undefined2 uStack_8618;
  undefined6 uStack_8616;
  undefined2 uStack_8610;
  undefined6 uStack_860e;
  undefined2 uStack_8608;
  undefined8 uStack_8606;
  undefined8 uStack_85fe;
  undefined8 local_85e8;
  undefined8 uStack_85e0;
  undefined2 uStack_85d8;
  undefined6 uStack_85d6;
  undefined2 uStack_85d0;
  undefined6 uStack_85ce;
  undefined2 uStack_85c8;
  undefined8 uStack_85c6;
  undefined8 uStack_85be;
  uchar local_85a8 [48];
  uchar local_8578 [64];
  undefined8 local_8538;
  undefined8 uStack_8530;
  undefined2 uStack_8528;
  undefined6 uStack_8526;
  undefined2 uStack_8520;
  undefined6 uStack_851e;
  undefined2 uStack_8518;
  undefined8 uStack_8516;
  undefined8 uStack_850e;
  
  local_8578[0x20] = 0;
  local_8578[0x21] = '\0';
  local_8578[0x22] = '\0';
  local_8578[0x23] = '\0';
  local_8578[0x24] = '\0';
  local_8578[0x25] = '\0';
  local_8578[0x26] = '\0';
  local_8578[0x27] = '\0';
  local_8578[0x28] = '\0';
  local_8578[0x29] = '\0';
  local_8578[0x2a] = '\0';
  local_8578[0x2b] = '\0';
  local_8578[0x2c] = '\0';
  local_8578[0x2d] = '\0';
  local_8578[0x2e] = '\0';
  local_8578[0x2f] = '\0';
  local_8578[0x30] = '\0';
  uStack_8608 = 0;
  uStack_8606 = 0;
  uStack_85fe = 0;
  uStack_85c8 = 0;
  uStack_85c6 = 0;
  uStack_85be = 0;
  local_85a8[0] = '\0';
  local_85a8[1] = '\0';
  local_85a8[2] = '\0';
  local_85a8[3] = '\0';
  local_85a8[4] = '\0';
  local_85a8[5] = '\0';
  local_85a8[6] = '\0';
  local_85a8[7] = '\0';
  local_85a8[8] = '\0';
  local_85a8[9] = '\0';
  local_85a8[10] = '\0';
  local_85a8[0xb] = '\0';
  local_85a8[0xc] = '\0';
  local_85a8[0xd] = '\0';
  local_85a8[0xe] = '\0';
  local_85a8[0xf] = '\0';
  local_85a8[0x10] = '\0';
  local_85a8[0x11] = '\0';
  local_85a8[0x12] = '\0';
  local_85a8[0x13] = '\0';
  local_85a8[0x14] = '\0';
  local_85a8[0x15] = '\0';
  local_85a8[0x16] = '\0';
  local_85a8[0x17] = '\0';
  local_85a8[0x18] = '\0';
  local_85a8[0x19] = '\0';
  local_85a8[0x1a] = '\0';
  local_85a8[0x1b] = '\0';
  local_85a8[0x1c] = '\0';
  local_85a8[0x1d] = '\0';
  local_85a8[0x1e] = '\0';
  local_85a8[0x1f] = '\0';
  local_85a8[0x20] = 0;
  local_8578[0] = '\0';
  local_8578[1] = '\0';
  local_8578[2] = '\0';
  local_8578[3] = '\0';
  local_8578[4] = '\0';
  local_8578[5] = '\0';
  local_8578[6] = '\0';
  local_8578[7] = '\0';
  local_8578[8] = '\0';
  local_8578[9] = '\0';
  local_8578[10] = '\0';
  local_8578[0xb] = '\0';
  local_8578[0xc] = '\0';
  local_8578[0xd] = '\0';
  local_8578[0xe] = '\0';
  local_8578[0xf] = '\0';
  local_8578[0x10] = 0;
  local_8578[0x11] = '\0';
  local_8578[0x12] = '\0';
  local_8578[0x13] = '\0';
  local_8578[0x14] = '\0';
  local_8578[0x15] = '\0';
  local_8578[0x16] = '\0';
  local_8578[0x17] = '\0';
  local_8578[0x18] = 0;
  local_8578[0x19] = '\0';
  local_8578[0x1a] = '\0';
  local_8578[0x1b] = '\0';
  local_8578[0x1c] = '\0';
  local_8578[0x1d] = '\0';
  local_8578[0x1e] = '\0';
  local_8578[0x1f] = '\0';
  local_8628 = 0;
  uStack_8620 = 0;
  uStack_8618 = 0;
  uStack_8616 = 0;
  uStack_8610 = 0;
  uStack_860e = 0;
  local_85e8 = 0;
  uStack_85e0 = 0;
  uStack_85d8 = 0;
  uStack_85d6 = 0;
  uStack_85d0 = 0;
  uStack_85ce = 0;
  memset(&local_8538,0,0x8526);
  iVar8 = crypto_sign_keypair(local_85a8,local_8578);
  if (iVar8 != 0) {
    __s = "Failed to generate key pair";
    goto LAB_0010129a;
  }
  local_8630 = 0x8526;
  iVar8 = crypto_sign((uchar *)&local_8538,&local_8630,(uchar *)&local_8628,0x32,local_8578);
  if (iVar8 == 0) {
    local_8638 = 0x32;
    uVar9 = crypto_sign_open((uchar *)&local_85e8,&local_8638,(uchar *)&local_8538,local_8630,
                             local_85a8);
    if (uVar9 != 0) {
LAB_001012df:
      printf("Failed to verify (ret = %d)\n",(ulong)uVar9);
      return -1;
    }
    if (local_8638 != 0x32) {
LAB_001013f0:
      printf("length of message after verify incorrect, got %llu, expected %zu\n",local_8638,0x32);
      return -1;
    }
    auVar2._6_2_ = uStack_8610;
    auVar2._0_6_ = uStack_8616;
    auVar2._8_6_ = uStack_860e;
    auVar2._14_2_ = uStack_8608;
    auVar2._16_8_ = uStack_8606;
    auVar2._24_8_ = uStack_85fe;
    auVar10._8_8_ = uStack_8620;
    auVar10._0_8_ = local_8628;
    auVar10._16_2_ = uStack_8618;
    auVar10._18_6_ = uStack_8616;
    auVar10._24_2_ = uStack_8610;
    auVar10._26_6_ = uStack_860e;
    auVar4._8_8_ = uStack_85e0;
    auVar4._0_8_ = local_85e8;
    auVar4._16_2_ = uStack_85d8;
    auVar4._18_6_ = uStack_85d6;
    auVar4._24_2_ = uStack_85d0;
    auVar4._26_6_ = uStack_85ce;
    auVar5._6_2_ = uStack_85d0;
    auVar5._0_6_ = uStack_85d6;
    auVar5._8_6_ = uStack_85ce;
    auVar5._14_2_ = uStack_85c8;
    auVar5._16_8_ = uStack_85c6;
    auVar5._24_8_ = uStack_85be;
    auVar10 = vpternlogq_avx512vl(auVar10 ^ auVar4,auVar2,auVar5,0xf6);
    if (auVar10 == (undefined1  [32])0x0) {
      local_8630 = 0x8526;
      uStack_8518 = uStack_8608;
      uStack_8516 = uStack_8606;
      uStack_850e = uStack_85fe;
      local_8538 = local_8628;
      uStack_8530 = uStack_8620;
      uStack_8528 = uStack_8618;
      uStack_8526 = uStack_8616;
      uStack_8520 = uStack_8610;
      uStack_851e = uStack_860e;
      iVar8 = crypto_sign((uchar *)&local_8538,&local_8630,(uchar *)&local_8538,0x32,local_8578);
      if (iVar8 != 0) goto LAB_00101293;
      local_8638 = local_8630;
      uVar9 = crypto_sign_open((uchar *)&local_8538,&local_8638,(uchar *)&local_8538,local_8630,
                               local_85a8);
      if (uVar9 != 0) goto LAB_001012df;
      if (local_8638 != 0x32) goto LAB_001013f0;
      auVar3._6_2_ = uStack_8610;
      auVar3._0_6_ = uStack_8616;
      auVar3._8_6_ = uStack_860e;
      auVar3._14_2_ = uStack_8608;
      auVar3._16_8_ = uStack_8606;
      auVar3._24_8_ = uStack_85fe;
      auVar1._8_8_ = uStack_8620;
      auVar1._0_8_ = local_8628;
      auVar1._16_2_ = uStack_8618;
      auVar1._18_6_ = uStack_8616;
      auVar1._24_2_ = uStack_8610;
      auVar1._26_6_ = uStack_860e;
      auVar6._8_8_ = uStack_8530;
      auVar6._0_8_ = local_8538;
      auVar6._16_2_ = uStack_8528;
      auVar6._18_6_ = uStack_8526;
      auVar6._24_2_ = uStack_8520;
      auVar6._26_6_ = uStack_851e;
      auVar7._6_2_ = uStack_8520;
      auVar7._0_6_ = uStack_8526;
      auVar7._8_6_ = uStack_851e;
      auVar7._14_2_ = uStack_8518;
      auVar7._16_8_ = uStack_8516;
      auVar7._24_8_ = uStack_850e;
      auVar10 = vpternlogq_avx512vl(auVar1 ^ auVar6,auVar3,auVar7,0xf6);
      if (auVar10 == (undefined1  [32])0x0) {
        puts("Sign/Verify test passed");
        return 0;
      }
    }
    __s = "message mismatch after verification";
  }
  else {
LAB_00101293:
    __s = "Failed to sign";
  }
LAB_0010129a:
  puts(__s);
  return -1;
}

Assistant:

int main(void) {
  unsigned char pk[CRYPTO_PUBLICKEYBYTES]          = {0};
  unsigned char sk[CRYPTO_SECRETKEYBYTES]          = {0};
  const unsigned char message[50]                  = {0};
  unsigned char omessage[sizeof(message)]          = {0};
  unsigned char sm[sizeof(message) + CRYPTO_BYTES] = {0};

  int ret = crypto_sign_keypair(pk, sk);
  VALGRIND_MAKE_MEM_DEFINED(&ret, sizeof(ret));
  if (ret != 0) {
    printf("Failed to generate key pair\n");
    return -1;
  }

  VALGRIND_MAKE_MEM_UNDEFINED(sk, sizeof(sk));
  VALGRIND_MAKE_MEM_UNDEFINED(message, sizeof(message));

  unsigned long long smlen = sizeof(sm);
  ret                      = crypto_sign(sm, &smlen, message, sizeof(message), sk);
  if (ret != 0) {
    printf("Failed to sign\n");
    return -1;
  }

  VALGRIND_MAKE_MEM_DEFINED(sm, smlen);
  VALGRIND_MAKE_MEM_DEFINED(sk, sizeof(sk));
  VALGRIND_MAKE_MEM_DEFINED(message, sizeof(message));

  unsigned long long mlen = sizeof(omessage);
  ret                     = crypto_sign_open(omessage, &mlen, sm, smlen, pk);
  if (ret != 0) {
    printf("Failed to verify (ret = %d)\n", ret);
    return -1;
  }

  if (mlen != sizeof(message)) {
    printf("length of message after verify incorrect, got " LL_FMT ", expected " SIZET_FMT "\n",
           mlen, sizeof(message));
    return -1;
  }
  if (memcmp(message, omessage, sizeof(message)) != 0) {
    printf("message mismatch after verification\n");
    return -1;
  }

  // test special case where message and signature overlap
  memcpy(sm, message, sizeof(message));

  smlen = sizeof(sm);
  ret   = crypto_sign(sm, &smlen, sm, sizeof(message), sk);
  if (ret != 0) {
    printf("Failed to sign\n");
    return -1;
  }

  mlen = smlen;
  ret  = crypto_sign_open(sm, &mlen, sm, smlen, pk);
  if (ret != 0) {
    printf("Failed to verify (ret = %d)\n", ret);
    return -1;
  }

  if (mlen != sizeof(message)) {
    printf("length of message after verify incorrect, got " LL_FMT ", expected " SIZET_FMT "\n",
           mlen, sizeof(message));
    return -1;
  }
  if (memcmp(message, sm, sizeof(message)) != 0) {
    printf("message mismatch after verification\n");
    return -1;
  }

  printf("Sign/Verify test passed\n");

  return 0;
}